

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

char16_t * PAL_wcsrchr(char16_t *string,char16_t c)

{
  char16_t *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    pcVar1 = (char16_t *)0x0;
    for (; *string != L'\0'; string = string + 1) {
      if (*string == c) {
        pcVar1 = string;
      }
    }
    return pcVar1;
  }
  abort();
}

Assistant:

char16_t _WConst_return *
__cdecl
PAL_wcsrchr(
        const char16_t * string,
        char16_t c)
{
    char16_t *last = NULL;

    PERF_ENTRY(wcsrchr);
    ENTRY("wcsrchr (string=%p (%S), c=%C)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING, c);

    while (*string)
    {
        if (*string == c)
        {
            last = (char16_t *) string;
        }
        string++;
    }

    LOGEXIT("wcsrchr returning char16_t %p (%S)\n", last?last:W16_NULLSTRING, last?last:W16_NULLSTRING);
    PERF_EXIT(wcsrchr);
    return (char16_t *)last;
}